

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O1

void __thiscall
ClCommandLine_AliasBool_Test::~ClCommandLine_AliasBool_Test(ClCommandLine_AliasBool_Test *this)

{
  anon_unknown.dwarf_26ec6::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, AliasBool) {
    opt<bool> opt{"opt"};
    alias opt2{"o", aliasopt{opt}};

    this->add ("progname", "-o");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);
    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt.get_num_occurrences (), 1U);
    EXPECT_EQ (opt.get (), true);
    EXPECT_EQ (opt2.get_num_occurrences (), 1U);
}